

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall
CircularArrayTest_clear_Test::~CircularArrayTest_clear_Test(CircularArrayTest_clear_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CircularArrayTest, clear) {
  CircularArray<TestObject, 2> ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));
  ASSERT_EQ(2U, ca.size());

  ca.clear();
  ASSERT_EQ(0U, ca.size());
}